

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::insertNode<std::array<float,2ul>>
          (Earcut<unsigned_int> *this,size_t i,array<float,_2UL> *pt,Node *last)

{
  Node *pNVar1;
  Node **ppNVar2;
  Node *pNVar3;
  float local_14;
  float local_10;
  uint local_c;
  
  local_c = (uint)i;
  local_10 = pt->_M_elems[0];
  local_14 = pt->_M_elems[1];
  pNVar1 = ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
           ::construct<unsigned_int,float,float>
                     ((ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
                       *)&this->nodes,&local_c,&local_10,&local_14);
  if (last == (Node *)0x0) {
    ppNVar2 = &pNVar1->next;
    pNVar3 = pNVar1;
  }
  else {
    ppNVar2 = &last->next;
    pNVar3 = last->next;
    pNVar1->next = pNVar3;
    pNVar1->prev = last;
  }
  pNVar3->prev = pNVar1;
  *ppNVar2 = pNVar1;
  return pNVar1;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::insertNode(std::size_t i, const Point& pt, Node* last) {
    Node* p = nodes.construct(static_cast<N>(i), util::nth<0, Point>::get(pt), util::nth<1, Point>::get(pt));

    if (!last) {
        p->prev = p;
        p->next = p;

    } else {
        assert(last);
        p->next = last->next;
        p->prev = last;
        last->next->prev = p;
        last->next = p;
    }
    return p;
}